

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MessageQueue.cpp
# Opt level: O2

void __thiscall f8n::runtime::MessageQueue::Unregister(MessageQueue *this,IMessageTarget *target)

{
  iterator iVar1;
  IMessageTarget *target_local;
  LockT lock;
  
  target_local = target;
  std::unique_lock<std::mutex>::unique_lock(&lock,&this->queueMutex);
  iVar1 = std::
          _Rb_tree<f8n::runtime::IMessageTarget_*,_f8n::runtime::IMessageTarget_*,_std::_Identity<f8n::runtime::IMessageTarget_*>,_std::less<f8n::runtime::IMessageTarget_*>,_std::allocator<f8n::runtime::IMessageTarget_*>_>
          ::find(&(this->targets)._M_t,&target_local);
  if ((_Rb_tree_header *)iVar1._M_node == &(this->targets)._M_t._M_impl.super__Rb_tree_header) {
    std::unique_lock<std::mutex>::~unique_lock(&lock);
  }
  else {
    std::
    _Rb_tree<f8n::runtime::IMessageTarget_*,_f8n::runtime::IMessageTarget_*,_std::_Identity<f8n::runtime::IMessageTarget_*>,_std::less<f8n::runtime::IMessageTarget_*>,_std::allocator<f8n::runtime::IMessageTarget_*>_>
    ::erase(&(this->targets)._M_t,&target_local);
    std::unique_lock<std::mutex>::~unique_lock(&lock);
    (*(this->super_IMessageQueue)._vptr_IMessageQueue[3])(this,target_local,0xffffffffffffffff);
  }
  return;
}

Assistant:

void MessageQueue::Unregister(IMessageTarget* target) {
    bool shouldRemove = false;
    {
        LockT lock(this->queueMutex);
        if (this->targets.find(target) != this->targets.end()) {
            this->targets.erase(target);
            shouldRemove = true;
        }
    }
    if (shouldRemove) {
        this->Remove(target);
    }
}